

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.cc
# Opt level: O3

bool __thiscall PcodeOp::isCseMatch(PcodeOp *this,PcodeOp *op)

{
  OpCode OVar1;
  pointer ppVVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  Varnode *pVVar5;
  Varnode *pVVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  
  if (((((this->flags & 0x18000) != 0) && ((op->flags & 0x18000) != 0)) &&
      (this->output->size == op->output->size)) &&
     ((OVar1 = this->opcode->opcode, OVar1 != CPUI_COPY && (OVar1 == op->opcode->opcode)))) {
    ppVVar2 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar3 = (this->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    lVar7 = (long)ppVVar3 - (long)ppVVar2;
    ppVVar4 = (op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (lVar7 == (long)(op->inrefs).super__Vector_base<Varnode_*,_std::allocator<Varnode_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish - (long)ppVVar4) {
      if (ppVVar3 == ppVVar2) {
        return true;
      }
      uVar8 = lVar7 >> 3;
      uVar9 = 0;
      while( true ) {
        pVVar5 = ppVVar2[uVar9];
        pVVar6 = ppVVar4[uVar9];
        if ((pVVar5 != pVVar6) &&
           ((((pVVar5->flags & 2) == 0 || ((pVVar6->flags & 2) == 0)) ||
            ((pVVar5->loc).offset != (pVVar6->loc).offset)))) break;
        uVar9 = uVar9 + 1;
        if (uVar8 + (uVar8 == 0) == uVar9) {
          return uVar8 <= uVar9;
        }
      }
    }
  }
  return false;
}

Assistant:

bool PcodeOp::isCseMatch(const PcodeOp *op) const

{
  if ((getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return false;
  if ((op->getEvalType()&(PcodeOp::unary|PcodeOp::binary))==0) return false;
  if (output->getSize() != op->output->getSize()) return false;
  if (code() != op->code()) return false;
  if (code() == CPUI_COPY) return false; // Let copy propagation deal with this
  if (inrefs.size() != op->inrefs.size()) return false;
  for(int4 i=0;i<inrefs.size();++i) {
    const Varnode *vn1 = getIn(i);
    const Varnode *vn2 = op->getIn(i);
    if (vn1 == vn2) continue;
    if (vn1->isConstant()&&vn2->isConstant()&&(vn1->getOffset()==vn2->getOffset()))
      continue;
    return false;
  }
  return true;
}